

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_image_t * decoder_get_frame(aom_codec_alg_priv_t *ctx,aom_codec_iter_t *iter)

{
  uchar **ppuVar1;
  ulong uVar2;
  char cVar3;
  AVxWorker *pAVar4;
  long *plVar5;
  long lVar6;
  AV1Decoder *pbi;
  RefCntBuffer *pRVar7;
  uchar *puVar8;
  _Bool _Var9;
  int iVar10;
  AVxWorkerInterface *pAVar11;
  aom_image_t *paVar12;
  uint uVar13;
  int iVar14;
  AV1_COMMON *pAVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  int tile_height;
  int tile_width;
  aom_film_grain_t *grain_params;
  YV12_BUFFER_CONFIG *sd;
  int local_50;
  int local_4c;
  AV1_COMMON *local_48;
  aom_film_grain_t *local_40;
  YV12_BUFFER_CONFIG *local_38;
  
  if ((iter != (aom_codec_iter_t *)0x0) && (ctx->frame_worker != (AVxWorker *)0x0)) {
    pAVar11 = aom_get_worker_interface();
    pAVar4 = ctx->frame_worker;
    plVar5 = (long *)pAVar4->data1;
    lVar6 = *plVar5;
    *(undefined8 *)(lVar6 + 0x5ff08) = 0;
    iVar10 = (*pAVar11->sync)(pAVar4);
    if (iVar10 == 0) {
      *(undefined4 *)(plVar5 + 5) = 0;
      ctx->need_resync = 1;
    }
    else {
      pbi = (AV1Decoder *)*plVar5;
      if (((((int)plVar5[5] == 1) && (*(undefined4 *)(plVar5 + 5) = 0, ctx->need_resync == 1)) &&
          (pbi->need_resync == 0)) && (((pbi->common).current_frame.frame_type & 0xfd) == 0)) {
        ctx->need_resync = 0;
      }
      iVar10 = av1_get_raw_frame(pbi,(size_t)*iter,&local_38,&local_40);
      if (iVar10 == 0) {
        pRVar7 = *(RefCntBuffer **)(lVar6 + 0x58d58 + (long)*iter * 8);
        ctx->last_show_frame = pRVar7;
        if (ctx->need_resync == 0) {
          paVar12 = &ctx->img;
          aom_img_remove_metadata(paVar12);
          yuvconfig2image(paVar12,local_38,(void *)plVar5[4]);
          if (*(aom_metadata_array_t **)(lVar6 + 0x5f718) != (aom_metadata_array_t *)0x0) {
            (ctx->img).metadata = *(aom_metadata_array_t **)(lVar6 + 0x5f718);
            *(undefined8 *)(lVar6 + 0x5f718) = 0;
          }
          pAVar15 = (AV1_COMMON *)(lVar6 + 0x3b60);
          if (*(int *)(lVar6 + 0x58df0) == 0) {
            if (*(int *)(lVar6 + 0x9e44) != 0) {
              *iter = (aom_codec_iter_t)((long)*iter + 1);
              aom_img_remove_metadata(paVar12);
              yuvconfig2image(paVar12,(YV12_BUFFER_CONFIG *)(lVar6 + 0x5f600),(void *)0x0);
              if (*(aom_metadata_array_t **)(lVar6 + 0x5f718) != (aom_metadata_array_t *)0x0) {
                (ctx->img).metadata = *(aom_metadata_array_t **)(lVar6 + 0x5f718);
                *(undefined8 *)(lVar6 + 0x5f718) = 0;
                return paVar12;
              }
              return paVar12;
            }
            bVar16 = *(char *)(*(long *)(lVar6 + 0x9be8) + 0x4d) == '\0';
          }
          else {
            cVar3 = *(char *)(*(long *)(lVar6 + 0x9be8) + 0x4d);
            bVar16 = cVar3 == '\0';
            if ((*(int *)(lVar6 + 0x9e48) != 0) && (-1 < *(int *)(lVar6 + 0x58da0))) {
              local_48 = pAVar15;
              _Var9 = av1_get_uniform_tile_size(pAVar15,&local_4c,&local_50);
              if (!_Var9) {
                return (aom_image_t *)0x0;
              }
              iVar10 = *(int *)(lVar6 + 0x9c04) + -1;
              if (*(int *)(lVar6 + 0x58da0) < iVar10) {
                iVar10 = *(int *)(lVar6 + 0x58da0);
              }
              iVar10 = iVar10 * local_50;
              ppuVar1 = (ctx->img).planes;
              *ppuVar1 = *ppuVar1 + (long)(ctx->img).stride[0] * (long)iVar10 * 4;
              pAVar15 = local_48;
              if (cVar3 == '\0') {
                uVar13 = (4U >> ((byte)(ctx->img).y_chroma_shift & 0x1f)) * iVar10;
                uVar2 = *(ulong *)((ctx->img).stride + 1);
                iVar14 = (int)((uVar2 >> 0x20) * (ulong)uVar13);
                auVar17._0_4_ = (int)((ulong)uVar13 * (uVar2 & 0xffffffff));
                auVar17._4_4_ = iVar14;
                puVar8 = (ctx->img).planes[2];
                auVar17._8_4_ = iVar14;
                auVar17._12_4_ = -(uint)(iVar14 < 0);
                (ctx->img).planes[1] =
                     (ctx->img).planes[1] + CONCAT44(-(uint)(auVar17._0_4_ < 0),auVar17._0_4_);
                (ctx->img).planes[2] = puVar8 + auVar17._8_8_;
                iVar10 = *(int *)(lVar6 + 0x3d74) - iVar10;
                if (local_50 < iVar10) {
                  iVar10 = local_50;
                }
                (ctx->img).d_h = iVar10 << 2;
                bVar16 = true;
              }
              else {
                iVar10 = *(int *)(lVar6 + 0x3d74) - iVar10;
                if (local_50 < iVar10) {
                  iVar10 = local_50;
                }
                (ctx->img).d_h = iVar10 << 2;
                bVar16 = false;
              }
            }
          }
          if (((*(int *)(lVar6 + 0x58df0) != 0) && (*(int *)(lVar6 + 0x9e48) != 0)) &&
             (-1 < *(int *)(lVar6 + 0x58da4))) {
            _Var9 = av1_get_uniform_tile_size(pAVar15,&local_4c,&local_50);
            if (!_Var9) {
              return (aom_image_t *)0x0;
            }
            iVar10 = *(int *)(lVar6 + 0x9c00) + -1;
            if (*(int *)(lVar6 + 0x58da4) < iVar10) {
              iVar10 = *(int *)(lVar6 + 0x58da4);
            }
            iVar10 = iVar10 * local_4c;
            iVar14 = (((ctx->img).fmt >> 0xb & 1) != 0) + 1;
            ppuVar1 = (ctx->img).planes;
            *ppuVar1 = *ppuVar1 + iVar10 * iVar14 * 4;
            if (bVar16) {
              iVar14 = (4U >> ((byte)(ctx->img).x_chroma_shift & 0x1f)) * iVar14 * iVar10;
              ppuVar1 = (ctx->img).planes + 1;
              *ppuVar1 = *ppuVar1 + iVar14;
              ppuVar1 = (ctx->img).planes + 2;
              *ppuVar1 = *ppuVar1 + iVar14;
            }
            iVar10 = *(int *)(lVar6 + 0x3d78) - iVar10;
            if (local_4c < iVar10) {
              iVar10 = local_4c;
            }
            (ctx->img).d_w = iVar10 << 2;
          }
          (ctx->img).fb_priv = (pRVar7->raw_frame_buffer).priv;
          iVar10 = pRVar7->spatial_id;
          (ctx->img).temporal_id = pRVar7->temporal_id;
          (ctx->img).spatial_id = iVar10;
          if (*(int *)(lVar6 + 0x5f728) != 0) {
            local_40->apply_grain = 0;
          }
          paVar12 = add_grain_if_needed(ctx,paVar12,&ctx->image_with_grain,local_40);
          if (paVar12 != (aom_image_t *)0x0) {
            *iter = (aom_codec_iter_t)((long)*iter + 1);
            return paVar12;
          }
          *(undefined8 *)(lVar6 + 0x5ff08) = 0x100000007;
          builtin_strncpy((char *)(lVar6 + 0x5ff10),"Grain sy",8);
          builtin_strncpy((char *)(lVar6 + 0x5ff18),"nthesis ",8);
          *(undefined8 *)(lVar6 + 0x5ff20) = 0xa64656c696166;
        }
      }
    }
  }
  return (aom_image_t *)0x0;
}

Assistant:

static aom_image_t *decoder_get_frame(aom_codec_alg_priv_t *ctx,
                                      aom_codec_iter_t *iter) {
  aom_image_t *img = NULL;

  if (!iter) {
    return NULL;
  }

  // To avoid having to allocate any extra storage, treat 'iter' as
  // simply a pointer to an integer index
  uintptr_t *index = (uintptr_t *)iter;

  if (ctx->frame_worker == NULL) {
    return NULL;
  }
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  AVxWorker *const worker = ctx->frame_worker;
  FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
  AV1Decoder *const pbi = frame_worker_data->pbi;
  pbi->error.error_code = AOM_CODEC_OK;
  pbi->error.has_detail = 0;
  AV1_COMMON *const cm = &pbi->common;
  CommonTileParams *const tiles = &cm->tiles;
  // Wait for the frame from worker thread.
  if (!winterface->sync(worker)) {
    // Decoding failed. Release the worker thread.
    frame_worker_data->received_frame = 0;
    ctx->need_resync = 1;
    // TODO(aomedia:3519): Set an error code. Check if a different error code
    // should be used if ctx->flushed != 1.
    return NULL;
  }
  // Check if worker has received any frames.
  if (frame_worker_data->received_frame == 1) {
    frame_worker_data->received_frame = 0;
    check_resync(ctx, frame_worker_data->pbi);
  }
  YV12_BUFFER_CONFIG *sd;
  aom_film_grain_t *grain_params;
  if (av1_get_raw_frame(frame_worker_data->pbi, *index, &sd, &grain_params) !=
      0) {
    return NULL;
  }
  RefCntBuffer *const output_frame_buf = pbi->output_frames[*index];
  ctx->last_show_frame = output_frame_buf;
  if (ctx->need_resync) return NULL;
  aom_img_remove_metadata(&ctx->img);
  yuvconfig2image(&ctx->img, sd, frame_worker_data->user_priv);
  move_decoder_metadata_to_img(pbi, &ctx->img);

  if (!pbi->ext_tile_debug && tiles->large_scale) {
    *index += 1;  // Advance the iterator to point to the next image
    aom_img_remove_metadata(&ctx->img);
    yuvconfig2image(&ctx->img, &pbi->tile_list_outbuf, NULL);
    move_decoder_metadata_to_img(pbi, &ctx->img);
    img = &ctx->img;
    return img;
  }

  const int num_planes = av1_num_planes(cm);
  if (pbi->ext_tile_debug && tiles->single_tile_decoding &&
      pbi->dec_tile_row >= 0) {
    int tile_width, tile_height;
    if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
      return NULL;
    }
    const int tile_row = AOMMIN(pbi->dec_tile_row, tiles->rows - 1);
    const int mi_row = tile_row * tile_height;
    const int ssy = ctx->img.y_chroma_shift;
    int plane;
    ctx->img.planes[0] += mi_row * MI_SIZE * ctx->img.stride[0];
    if (num_planes > 1) {
      for (plane = 1; plane < MAX_MB_PLANE; ++plane) {
        ctx->img.planes[plane] +=
            mi_row * (MI_SIZE >> ssy) * ctx->img.stride[plane];
      }
    }
    ctx->img.d_h =
        AOMMIN(tile_height, cm->mi_params.mi_rows - mi_row) * MI_SIZE;
  }

  if (pbi->ext_tile_debug && tiles->single_tile_decoding &&
      pbi->dec_tile_col >= 0) {
    int tile_width, tile_height;
    if (!av1_get_uniform_tile_size(cm, &tile_width, &tile_height)) {
      return NULL;
    }
    const int tile_col = AOMMIN(pbi->dec_tile_col, tiles->cols - 1);
    const int mi_col = tile_col * tile_width;
    const int ssx = ctx->img.x_chroma_shift;
    const int is_hbd = (ctx->img.fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 1 : 0;
    int plane;
    ctx->img.planes[0] += mi_col * MI_SIZE * (1 + is_hbd);
    if (num_planes > 1) {
      for (plane = 1; plane < MAX_MB_PLANE; ++plane) {
        ctx->img.planes[plane] += mi_col * (MI_SIZE >> ssx) * (1 + is_hbd);
      }
    }
    ctx->img.d_w = AOMMIN(tile_width, cm->mi_params.mi_cols - mi_col) * MI_SIZE;
  }

  ctx->img.fb_priv = output_frame_buf->raw_frame_buffer.priv;
  img = &ctx->img;
  img->temporal_id = output_frame_buf->temporal_id;
  img->spatial_id = output_frame_buf->spatial_id;
  if (pbi->skip_film_grain) grain_params->apply_grain = 0;
  aom_image_t *res =
      add_grain_if_needed(ctx, img, &ctx->image_with_grain, grain_params);
  if (!res) {
    pbi->error.error_code = AOM_CODEC_CORRUPT_FRAME;
    pbi->error.has_detail = 1;
    snprintf(pbi->error.detail, sizeof(pbi->error.detail),
             "Grain synthesis failed\n");
    return res;
  }
  *index += 1;  // Advance the iterator to point to the next image
  return res;
}